

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::mmap_cache_alert::~mmap_cache_alert(mmap_cache_alert *this)

{
  mmap_cache_alert *this_local;
  
  ~mmap_cache_alert(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

struct TORRENT_DEPRECATED_EXPORT mmap_cache_alert final : alert
	{
		mmap_cache_alert(aux::stack_allocator& alloc
			, error_code const& ec);
		TORRENT_DEFINE_ALERT(mmap_cache_alert, 69)

		static constexpr alert_category_t static_category = alert_category::error;
		std::string message() const override;

		error_code const error;
	}